

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

bool __thiscall MyServer::Initialize(MyServer *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  bool bVar1;
  SDKJsonResult result;
  string asStack_1e8 [32];
  undefined1 local_1c8 [40];
  LogStringBuffer local_1a0;
  
  (this->super_SDKSocket).Config.UDPListenPort = 0x13c4;
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.MinuteFloodThresh = 2;
  (this->super_SDKSocket).Config.BandwidthLimitBPS = 4000000;
  (this->super_SDKSocket).Config.Flags = 6;
  tonk::SDKSocket::Create((SDKJsonResult *)local_1c8,&this->super_SDKSocket);
  if (local_1c8._0_4_ == Tonk_Success) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string(asStack_1e8,(string *)(local_1c8 + 8));
    if ((int)Logger.ChannelMinLevel < 5) {
      this_00 = &local_1a0.LogStream;
      local_1a0.ChannelName = Logger.ChannelName;
      local_1a0.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
      std::operator<<((ostream *)this_00,"Unable to create socket: ");
      std::operator<<((ostream *)this_00,asStack_1e8);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,&local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    std::__cxx11::string::~string(asStack_1e8);
    bVar1 = local_1c8._0_4_ == Tonk_Success;
  }
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  return bVar1;
}

Assistant:

bool MyServer::Initialize()
{
    // Set configuration
    Config.UDPListenPort = kUDPServerPort_Server;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.MinuteFloodThresh = 2;
    Config.BandwidthLimitBPS = 4000000;
    //Config.InterfaceAddress = "127.0.0.1";

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
    }

    return result;
}